

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

Error __thiscall miniros::MasterLink::initLink(MasterLink *this,M_string *remappings)

{
  bool bVar1;
  const_iterator __s;
  pointer ppVar2;
  ulong uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  uint32_t *in_stack_00000028;
  string *in_stack_00000030;
  string *in_stack_00000038;
  bool enabled_1;
  bool enabled;
  char *master_uri_env;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee8;
  Level level;
  LogLocation *in_stack_fffffffffffffef0;
  LogLocation *in_stack_ffffffffffffff00;
  void *logger_handle;
  undefined8 in_stack_ffffffffffffff10;
  Level LVar5;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  LogLocation *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  allocator<char> local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  LogLocation local_89 [2];
  char *local_68;
  _Self local_60 [3];
  allocator<char> local_41;
  string local_40 [32];
  _Self local_20 [3];
  Error local_4;
  
  LVar5 = (Level)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (*in_RDI == 0) {
    Error::Error(&local_4,InternalError);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffff28,(allocator<char> *)in_stack_ffffffffffffff20);
    __s = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(in_stack_fffffffffffffee8,(key_type *)0x45785d);
    local_20[0]._M_node = __s._M_node;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffee8);
    level = (Level)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    bVar1 = std::operator!=(local_20,local_60);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x4578c8);
      std::__cxx11::string::operator=((string *)(*in_RDI + 0x38),(string *)&ppVar2->second);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      local_68 = (char *)0x0;
      local_68 = getenv("ROS_MASTER_URI");
      if (local_68 == (char *)0x0) {
        if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((initLink::loc.initialized_ ^ 0xffU) & 1) != 0) {
          in_stack_ffffffffffffff20 = local_89;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_RSI,(char *)__s._M_node,(allocator<char> *)in_stack_ffffffffffffff20);
          console::initializeLogLocation
                    (in_stack_ffffffffffffff20,
                     (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),LVar5);
          std::__cxx11::string::~string((string *)&local_89[0].logger_enabled_);
          std::allocator<char>::~allocator((allocator<char> *)local_89);
        }
        if (initLink::loc.level_ != Warn) {
          console::setLogLocationLevel(in_stack_fffffffffffffef0,level);
          console::checkLogLocationEnabled(in_stack_ffffffffffffff00);
        }
        in_stack_ffffffffffffff1f = (initLink::loc.logger_enabled_ & 1U) != 0;
        local_8a = in_stack_ffffffffffffff1f;
        if ((bool)in_stack_ffffffffffffff1f) {
          level = Debug;
          console::print((FilterBase *)0x0,initLink::loc.logger_,(Level)(ulong)initLink::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                         ,0x60,"Error miniros::MasterLink::initLink(const M_string &)");
        }
        std::__cxx11::string::operator=((string *)(*in_RDI + 0x38),"http://localhost:11311");
      }
      else {
        std::__cxx11::string::operator=((string *)(*in_RDI + 0x38),local_68);
      }
    }
    bVar1 = network::splitURI(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    if (bVar1) {
      Error::Error(&local_4,Ok);
    }
    else {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
            ::loc.initialized_ ^ 0xffU) & 1) != 0) {
        LVar5 = (Level)((ulong)&local_b1 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_RSI,(char *)__s._M_node,(allocator<char> *)in_stack_ffffffffffffff20);
        console::initializeLogLocation
                  (in_stack_ffffffffffffff20,
                   (string *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),LVar5);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.level_ != Fatal) {
        console::setLogLocationLevel(in_stack_fffffffffffffef0,level);
        console::checkLogLocationEnabled(in_stack_ffffffffffffff00);
      }
      LVar5 = initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
              ::loc.level_;
      if ((initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
           ::loc.logger_enabled_ & 1U) != 0) {
        logger_handle =
             initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
             ::loc.logger_;
        uVar4 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar5,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0x6b,"Error miniros::MasterLink::initLink(const M_string &)",
                       "Couldn\'t parse the master URI [%s] into a host:port pair.",uVar4);
      }
      Error::Error(&local_4,InvalidURI);
    }
  }
  return (Error)local_4.code;
}

Assistant:

Error MasterLink::initLink(const M_string& remappings)
{
  if (!internal_)
    return Error::InternalError;

  auto it = remappings.find("__master");
  if (it != remappings.end()) {
    internal_->uri = it->second;
  }

  if (internal_->uri.empty()) {
    char* master_uri_env = NULL;
#ifdef _MSC_VER
    _dupenv_s(&master_uri_env, NULL, "ROS_MASTER_URI");
#else
    master_uri_env = getenv("ROS_MASTER_URI");
#endif
    if (master_uri_env) {
      internal_->uri = master_uri_env;
    } else {
      MINIROS_WARN("Defaulting ROS_MASTER_URI to localhost:11311");
      internal_->uri = "http://localhost:11311";
    }
#ifdef _MSC_VER
    // http://msdn.microsoft.com/en-us/library/ms175774(v=vs.80).aspx
    free(master_uri_env);
#endif
  }

  // Split URI into
  if (!network::splitURI(internal_->uri, internal_->host, internal_->port)) {
    MINIROS_FATAL("Couldn't parse the master URI [%s] into a host:port pair.", internal_->uri.c_str());
    return Error::InvalidURI;
  }

  return Error::Ok;
}